

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O0

string * EncodeJSONString(string *__return_storage_ptr__,string *in)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_40;
  char c;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  const_iterator it;
  string *in_local;
  string *out;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::length();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_38._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    _Stack_40._M_current = (char *)std::__cxx11::string::end();
    bVar2 = __gnu_cxx::operator!=(&local_38,&stack0xffffffffffffffc0);
    if (!bVar2) break;
    pbVar3 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_38);
    bVar1 = *pbVar3;
    if (bVar1 == 8) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\b");
    }
    else if (bVar1 == 0xc) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\f");
    }
    else if (bVar1 == 10) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\n");
    }
    else if (bVar1 == 0xd) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\r");
    }
    else if (bVar1 == 9) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\t");
    }
    else if (((char)bVar1 < '\0') || ('\x1f' < (char)bVar1)) {
      if (bVar1 == 0x5c) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
      }
      else if (bVar1 == 0x22) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\"");
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,bVar1);
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\u00");
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,
                 EncodeJSONString::hex_digits[(int)(char)bVar1 >> 4]);
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,EncodeJSONString::hex_digits[bVar1 & 0xf]);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EncodeJSONString(const std::string& in) {
  static const char* hex_digits = "0123456789abcdef";
  std::string out;
  out.reserve(in.length() * 1.2);
  for (std::string::const_iterator it = in.begin(); it != in.end(); ++it) {
    char c = *it;
    if (c == '\b')
      out += "\\b";
    else if (c == '\f')
      out += "\\f";
    else if (c == '\n')
      out += "\\n";
    else if (c == '\r')
      out += "\\r";
    else if (c == '\t')
      out += "\\t";
    else if (0x0 <= c && c < 0x20) {
      out += "\\u00";
      out += hex_digits[c >> 4];
      out += hex_digits[c & 0xf];
    } else if (c == '\\')
      out += "\\\\";
    else if (c == '\"')
      out += "\\\"";
    else
      out += c;
  }
  return out;
}